

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O3

bool __thiscall ON_RevSurface::Trim(ON_RevSurface *this,int dir,ON_Interval *domain)

{
  ON_BoundingBox *this_00;
  ON_Interval *bin;
  ON_Interval *this_01;
  ON_Curve *pOVar1;
  double dVar2;
  double x;
  bool bVar3;
  int iVar4;
  double *pdVar5;
  ON_Interval dom;
  ON_Interval a;
  ON_BoundingBox local_98;
  ON_BoundingBox local_60;
  
  if (1 < (uint)dir) {
    return false;
  }
  bVar3 = ON_Interval::IsIncreasing(domain);
  if (bVar3) {
    iVar4 = 1 - dir;
    if (this->m_bTransposed == false) {
      iVar4 = dir;
    }
    if (iVar4 == 0) {
      ON_Interval::ON_Interval((ON_Interval *)&local_98);
      bin = &this->m_t;
      ON_Interval::Intersection((ON_Interval *)&local_98,domain,bin);
      bVar3 = ON_Interval::IsIncreasing((ON_Interval *)&local_98);
      if ((bVar3) && (bVar3 = ON_Interval::IsIncreasing(bin), bVar3)) {
        this_01 = &this->m_angle;
        bVar3 = ON_Interval::IsIncreasing(this_01);
        if (bVar3) {
          pdVar5 = ON_Interval::operator[]((ON_Interval *)&local_98,0);
          dVar2 = ON_Interval::NormalizedParameterAt(bin,*pdVar5);
          pdVar5 = ON_Interval::operator[]((ON_Interval *)&local_98,1);
          x = ON_Interval::NormalizedParameterAt(bin,*pdVar5);
          ON_Interval::ON_Interval((ON_Interval *)&local_60);
          dVar2 = ON_Interval::ParameterAt(this_01,dVar2);
          pdVar5 = ON_Interval::operator[]((ON_Interval *)&local_60,0);
          *pdVar5 = dVar2;
          dVar2 = ON_Interval::ParameterAt(this_01,x);
          pdVar5 = ON_Interval::operator[]((ON_Interval *)&local_60,1);
          *pdVar5 = dVar2;
          dVar2 = ON_Interval::Length((ON_Interval *)&local_60);
          if ((2.3283064365386963e-10 < ABS(dVar2)) && (ABS(dVar2) <= 6.283185307412417)) {
            this_01->m_t[0] = local_60.m_min.x;
            (this->m_angle).m_t[1] = local_60.m_min.y;
            dVar2 = domain->m_t[1];
            bin->m_t[0] = domain->m_t[0];
            (this->m_t).m_t[1] = dVar2;
            goto LAB_0059f647;
          }
        }
      }
    }
    else {
      pOVar1 = this->m_curve;
      if ((pOVar1 != (ON_Curve *)0x0) &&
         (iVar4 = (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3c])
                            (pOVar1,domain), (char)iVar4 != '\0')) {
LAB_0059f647:
        this_00 = &this->m_bbox;
        local_98.m_min.x = (this->m_bbox).m_min.x;
        local_98.m_min.y = (this->m_bbox).m_min.y;
        local_98.m_min.z = (this->m_bbox).m_min.z;
        local_98.m_max.x = (this->m_bbox).m_max.x;
        local_98.m_max.y = (this->m_bbox).m_max.y;
        local_98.m_max.z = (this->m_bbox).m_max.z;
        ON_BoundingBox::Destroy(this_00);
        ON_Geometry::BoundingBox(&local_60,(ON_Geometry *)this);
        bVar3 = ON_BoundingBox::IsValid(this_00);
        if ((bVar3) && (bVar3 = ON_BoundingBox::IsValid(&local_98), bVar3)) {
          ON_BoundingBox::Intersection(this_00,&local_98);
        }
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool ON_RevSurface::Trim( int dir, const ON_Interval& domain )
{
  bool rc = false;
  if ( dir != 0 && dir != 1 )
    return false;
  if ( !domain.IsIncreasing() )
    return false;
  if ( m_bTransposed )
    dir = 1-dir;
  if ( dir == 0 )
  {
    ON_Interval dom;
    dom.Intersection(domain,m_t);
    if ( !dom.IsIncreasing() || !m_t.IsIncreasing() || !m_angle.IsIncreasing() )
      return false;
    double t0 = m_t.NormalizedParameterAt(dom[0]);
    double t1 = m_t.NormalizedParameterAt(dom[1]);
    ON_Interval a;
    a[0] = m_angle.ParameterAt(t0);
    a[1] = m_angle.ParameterAt(t1);
    double d = a.Length();
    if ( fabs(d) > ON_ZERO_TOLERANCE && fabs(d) <= 2.0*ON_PI+ON_ZERO_TOLERANCE )
    {
      m_angle = a;
      m_t = domain;
      rc = true;
    }
  }
  else if ( dir == 1 && m_curve )
  {
    rc = m_curve->Trim( domain );
  }
  if ( rc )
  {
    // update bounding box
    ON_BoundingBox bbox0 = m_bbox;
    m_bbox.Destroy();
    BoundingBox();
    if ( m_bbox.IsValid() && bbox0.IsValid() )
      m_bbox.Intersection(bbox0);
  }
  return rc;
}